

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaUtil.cpp
# Opt level: O2

MatrixProperties *
parseSparseMatrix(MatrixProperties *__return_storage_ptr__,string *path,int resolution,string *chrom
                 )

{
  int iVar1;
  void *pvVar2;
  double *pdVar3;
  istream *piVar4;
  ostream *poVar5;
  reference pdVar6;
  int iVar7;
  int iVar8;
  size_type i;
  int j;
  size_type j_00;
  int w;
  int v;
  int n;
  int M;
  string *local_280;
  int local_274;
  string *local_270;
  double count;
  string line;
  ifstream file;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_230 [3];
  int aiStack_218 [122];
  
  (__return_storage_ptr__->matrix).
  super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->matrix).
  super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->chrom)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->chrom).field_2;
  (__return_storage_ptr__->chrom)._M_string_length = 0;
  (__return_storage_ptr__->chrom).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->BI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->BI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->BI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  M = 0;
  std::ifstream::ifstream(&file,(string *)path,_S_in);
  local_280 = chrom;
  local_274 = resolution;
  local_270 = path;
  if (*(int *)((long)aiStack_218 + *(long *)&_file[-1].data_) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    iVar7 = 0;
    iVar8 = 1;
    while( true ) {
      pvVar2 = (void *)std::istream::operator>>(&file,&v);
      pdVar3 = (double *)std::istream::operator>>(pvVar2,&w);
      piVar4 = std::istream::_M_extract<double>(pdVar3);
      iVar1 = local_274;
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      if (iVar7 < v) {
        iVar7 = v;
      }
      if (iVar7 < w) {
        iVar7 = w;
      }
      M = iVar8;
      iVar8 = iVar8 + 1;
    }
    iVar7 = iVar7 / local_274 + 1;
    n = iVar7;
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->chrom);
    __return_storage_ptr__->resolution = iVar1;
    poVar5 = std::operator<<((ostream *)&std::cerr,"Building matrix for chromosome ");
    poVar5 = std::operator<<(poVar5,(string *)&__return_storage_ptr__->chrom);
    poVar5 = std::operator<<(poVar5," at resolution ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,__return_storage_ptr__->resolution);
    poVar5 = std::operator<<(poVar5,"bp with ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
    poVar5 = std::operator<<(poVar5," rows.");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&file);
    poVar5 = std::operator<<((ostream *)&std::cerr,"Initializing matrix to zero elements");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::
    make_shared<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,int&,int&,int&>
              ((int *)&file,&n,&n);
    std::
    __shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)__return_storage_ptr__,
                (__shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)&file);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_230);
    iVar7 = n;
    for (i = 0; (long)i < (long)iVar7; i = i + 1) {
      for (j_00 = 0; (long)j_00 < (long)iVar7; j_00 = j_00 + 1) {
        pdVar6 = boost::numeric::ublas::
                 matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 ::at_element((__return_storage_ptr__->matrix).
                              super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,i,j_00);
        *pdVar6 = 0.0;
        iVar7 = n;
      }
    }
    std::ifstream::ifstream(&file,(string *)local_270,_S_in);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      pvVar2 = (void *)std::istream::operator>>(&file,&v);
      pdVar3 = (double *)std::istream::operator>>(pvVar2,&w);
      piVar4 = std::istream::_M_extract<double>(pdVar3);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      local_280 = (string *)count;
      pdVar6 = boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::at_element((__return_storage_ptr__->matrix).
                            super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(long)(v / iVar1),(long)(w / iVar1));
      *pdVar6 = (double)local_280;
    }
    MatrixProperties::computemuBI(__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&file);
    return __return_storage_ptr__;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Couldn\'t read file: ");
  poVar5 = std::operator<<(poVar5,(string *)local_270);
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(1);
}

Assistant:

MatrixProperties parseSparseMatrix(string path, int resolution, string chrom) {
    MatrixProperties prop;
    int M=0;
    int n;

    {
        ifstream file(path);
        if (!file.good()) {
            std::cerr << "Couldn't read file: " << path << std::endl;
            std::exit(1);
        }
        assert(file.good());

        string line;
        int v, w;
        double count;
        int maxv = 0;
        while ( file >> v >> w >> count )  {
            if (v > maxv) maxv = v;
            if (w > maxv) maxv = w;
            M++;
        }
        n = maxv/resolution+1;
        prop.chrom = chrom;
        prop.resolution = resolution;
        cerr << "Building matrix for chromosome " << prop.chrom << " at resolution " << prop.resolution << "bp with " << n << " rows." << endl;
    }

    cerr << "Initializing matrix to zero elements" << endl;
    prop.matrix = std::make_shared<SparseMatrix>(n,n,M);

    for (auto i = 0; i < n; i++) {
        for (auto j = 0; j < n; j++) {
            prop.matrix->insert_element(i,j, 0.0);
        }
    }
    
    ifstream file(path);
    string line;
    int v, w;
    double count;
    int m = 0;
    while ( file >> v >> w >> count )  {
        size_t i = v/resolution;
        size_t j = w/resolution;
        //prop.matrix->insert_element(i, j, log(count));
        prop.matrix->insert_element(i, j, count);
        m++;
        //if ( m % 100000 == 0 ) { std::cerr << "" << float(m)/M*100 << "%\n"; }
    }

    prop.computemuBI();
    return prop;
}